

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O3

uchar __thiscall chatra::Reader::readRawInteger<unsigned_char>(Reader *this)

{
  byte bVar1;
  pointer puVar2;
  ulong uVar3;
  bool bVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  checkSpace(this,1);
  uVar6 = this->offset;
  this->offset = uVar6 + 1;
  puVar2 = (this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->buffer->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    bVar1 = puVar2[uVar6];
    if (-1 < (char)bVar1) {
      return bVar1;
    }
    uVar7 = (ulong)(bVar1 & 0x7f);
    uVar6 = 7;
    while( true ) {
      checkSpace(this,1);
      uVar3 = this->offset;
      this->offset = uVar3 + 1;
      puVar2 = (this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->buffer->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) <= uVar3) break;
      bVar1 = puVar2[uVar3];
      if (-1 < (char)bVar1) {
        return (bVar1 < 0x40) - 1U ^ ((byte)uVar7 | (byte)((bVar1 & 0x3f) << ((byte)uVar6 & 0x3f)));
      }
      uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << ((byte)uVar6 & 0x3f);
      bVar4 = 0x38 < uVar6;
      uVar6 = uVar6 + 7;
      if (bVar4) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
        puVar5[2] = 0;
        puVar5[3] = 0;
        puVar5[4] = 0;
        puVar5[1] = puVar5 + 3;
        *(undefined1 *)(puVar5 + 3) = 0;
        *puVar5 = &PTR__NativeException_00242de8;
        __cxa_throw(puVar5,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Type readRawInteger() {
		checkSpace();
		auto t = static_cast<uint64_t>(buffer->at(offset++));
		if (t < 128)
			return static_cast<Type>(t);
		t &= 0x7FU;
		for (unsigned position = 7; position < 64; position += 7) {
			checkSpace();
			auto c = static_cast<uint64_t>(buffer->at(offset++));
			if (c & 0x80U)
				t |= (c & 0x7FU) << position;
			else {
				t |= (c & 0x3FU) << position;
				return static_cast<Type>(c & 0x40U ? ~t : t);
			}
		}
		throw IllegalArgumentException();
	}